

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcObj.c
# Opt level: O3

Abc_Obj_t * Abc_NtkDupBox(Abc_Ntk_t *pNtkNew,Abc_Obj_t *pBox,int fCopyName)

{
  Abc_Obj_t *pObj;
  Abc_Obj_t *pAVar1;
  long lVar2;
  
  if ((*(uint *)&pBox->field_0x14 & 0xf) == 10 || (*(uint *)&pBox->field_0x14 & 0xe) == 8) {
    pObj = Abc_NtkDupObj(pNtkNew,pBox,fCopyName);
    if (0 < (pBox->vFanins).nSize) {
      lVar2 = 0;
      do {
        pAVar1 = Abc_NtkDupObj(pNtkNew,(Abc_Obj_t *)
                                       pBox->pNtk->vObjs->pArray[(pBox->vFanins).pArray[lVar2]],
                               fCopyName);
        Abc_ObjAddFanin(pObj,pAVar1);
        lVar2 = lVar2 + 1;
      } while (lVar2 < (pBox->vFanins).nSize);
    }
    if (0 < (pBox->vFanouts).nSize) {
      lVar2 = 0;
      do {
        pAVar1 = Abc_NtkDupObj(pNtkNew,(Abc_Obj_t *)
                                       pBox->pNtk->vObjs->pArray[(pBox->vFanouts).pArray[lVar2]],
                               fCopyName);
        Abc_ObjAddFanin(pAVar1,pObj);
        lVar2 = lVar2 + 1;
      } while (lVar2 < (pBox->vFanouts).nSize);
    }
    return pObj;
  }
  __assert_fail("Abc_ObjIsBox(pBox)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcObj.c"
                ,0x1a2,"Abc_Obj_t *Abc_NtkDupBox(Abc_Ntk_t *, Abc_Obj_t *, int)");
}

Assistant:

Abc_Obj_t * Abc_NtkDupBox( Abc_Ntk_t * pNtkNew, Abc_Obj_t * pBox, int fCopyName )
{
    Abc_Obj_t * pTerm, * pBoxNew;
    int i;
    assert( Abc_ObjIsBox(pBox) );
    // duplicate the box 
    pBoxNew = Abc_NtkDupObj( pNtkNew, pBox, fCopyName );
    // duplicate the fanins and connect them
    Abc_ObjForEachFanin( pBox, pTerm, i )
        Abc_ObjAddFanin( pBoxNew, Abc_NtkDupObj(pNtkNew, pTerm, fCopyName) );
    // duplicate the fanouts and connect them
    Abc_ObjForEachFanout( pBox, pTerm, i )
        Abc_ObjAddFanin( Abc_NtkDupObj(pNtkNew, pTerm, fCopyName), pBoxNew );
    return pBoxNew;
}